

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_CalcHeight(player_t *player)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  double dVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  APlayerPawn *pAVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  
  uVar3 = player->cheats;
  if ((uVar3 >> 0x1e & 1) == 0) {
    pAVar7 = player->mo;
    if ((((pAVar7->super_AActor).flags.Value & 0x200) != 0) && (player->onground == false)) {
      player->bob = 0.5;
      dVar11 = 0.5;
      goto LAB_00583f54;
    }
    dVar11 = (player->Vel).X;
    dVar10 = (player->Vel).Y;
    dVar11 = dVar10 * dVar10 + dVar11 * dVar11;
    player->bob = dVar11;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      puVar5 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x21b) * 0x18));
      do {
        puVar6 = puVar5;
        puVar5 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x21b);
      dVar11 = dVar11 * (double)*(float *)(puVar6[2] + 0x28);
      player->bob = dVar11;
      if (16.0 < dVar11) {
        player->bob = 16.0;
        dVar11 = 16.0;
      }
      goto LAB_00583f54;
    }
    dVar10 = pAVar7->ViewHeight + player->crouchviewdelta;
    if ((uVar3 & 4) != 0) goto LAB_00583ff4;
    if (player->health < 1) {
      dVar11 = 0.0;
    }
    else {
      puVar5 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x21c) * 0x18));
      do {
        puVar6 = puVar5;
        puVar5 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x21c);
      fVar1 = *(float *)(puVar6[2] + 0x28);
      dVar11 = FFastTrig::sin(&fasttrig,
                              ((double)level.time / 120.0) * 360.0 * 11930464.711111112 +
                              6755399441055744.0);
      dVar11 = dVar11 * (double)fVar1;
    }
  }
  else {
    player->bob = 0.0;
    pAVar7 = player->mo;
    dVar11 = 0.0;
LAB_00583f54:
    dVar10 = pAVar7->ViewHeight + player->crouchviewdelta;
    if ((uVar3 & 4) != 0) {
LAB_00583ff4:
      dVar10 = dVar10 + (pAVar7->super_AActor).__Pos.Z;
      player->viewz = dVar10;
      dVar2 = (pAVar7->super_AActor).ceilingz + -4.0;
      if (dVar10 <= dVar2) {
        return;
      }
      goto LAB_005841bb;
    }
    dVar2 = FFastTrig::sin(&fasttrig,
                           ((double)level.time / 20.0) * 360.0 * 11930464.711111112 +
                           6755399441055744.0);
    dVar11 = dVar11 * dVar2 *
             *(double *)(&DAT_0076bc30 + (ulong)(1 < (player->mo->super_AActor).waterlevel) * 8);
  }
  if (player->playerstate == '\0') {
    dVar2 = player->deltaviewheight;
    uVar8 = SUB84(dVar2,0);
    uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
    dVar4 = player->viewheight + dVar2;
    player->viewheight = dVar4;
    if (dVar4 <= dVar10) {
      dVar10 = dVar10 * 0.5;
      if ((dVar10 <= dVar4) || (player->viewheight = dVar10, dVar4 = dVar10, 0.0 < dVar2)) {
        dVar10 = dVar4;
        if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_00584135;
      }
      else {
        uVar8 = 0;
        uVar9 = 0x3ef00000;
      }
      dVar2 = (double)CONCAT44(uVar9,uVar8) + 0.25;
      player->deltaviewheight = dVar2;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        player->deltaviewheight = 1.52587890625e-05;
      }
    }
    else {
      player->viewheight = dVar10;
      player->deltaviewheight = 0.0;
    }
  }
  else {
    dVar10 = player->viewheight;
  }
LAB_00584135:
  if (player->morphTics != 0) {
    dVar11 = 0.0;
  }
  pAVar7 = player->mo;
  dVar2 = (pAVar7->super_AActor).__Pos.Z;
  dVar11 = dVar10 + dVar2 + dVar11;
  player->viewz = dVar11;
  if (player->playerstate != '\x01') {
    dVar10 = (pAVar7->super_AActor).Floorclip;
    if (((dVar10 != 0.0) || (NAN(dVar10))) && (dVar2 <= (pAVar7->super_AActor).floorz)) {
      dVar11 = dVar11 - dVar10;
      player->viewz = dVar11;
    }
  }
  dVar10 = (pAVar7->super_AActor).ceilingz + -4.0;
  if (dVar10 < dVar11) {
    player->viewz = dVar10;
    dVar11 = dVar10;
  }
  dVar2 = (pAVar7->super_AActor).floorz + 4.0;
  if (dVar2 <= dVar11) {
    return;
  }
LAB_005841bb:
  player->viewz = dVar2;
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + bob;
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}